

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindow::QMdiSubWindow(QMdiSubWindow *this,QWidget *parent,WindowFlags flags)

{
  ColorGroup CVar1;
  undefined4 uVar2;
  QPalettePrivate *pQVar3;
  QIconPrivate *pQVar4;
  undefined1 auVar5 [8];
  char cVar6;
  QMdiSubWindowPrivate *pQVar7;
  QLayout *pQVar8;
  QStyle *pQVar9;
  long in_FS_OFFSET;
  Connection CStack_58;
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  QAction **ppQStack_40;
  QWidgetData *local_28;
  
  local_28 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  pQVar7 = (QMdiSubWindowPrivate *)operator_new(0x470);
  QMdiSubWindowPrivate::QMdiSubWindowPrivate(pQVar7);
  QWidget::QWidget(&this->super_QWidget,(QWidgetPrivate *)pQVar7,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007f6570;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QMdiSubWindow_007f6720;
  pQVar7 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  QMdiSubWindowPrivate::createSystemMenu(pQVar7);
  QWidget::actions((QList<QAction_*> *)local_48,(QWidget *)(pQVar7->systemMenu).wp.value);
  QWidget::addActions(&this->super_QWidget,(QList<QAction_*> *)local_48);
  if (local_48 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)local_48 = *(int *)local_48 + -1;
    UNLOCK();
    if (*(int *)local_48 == 0) {
      QArrayData::deallocate((QArrayData *)local_48,8,0x10);
    }
  }
  (**(code **)(*(long *)&pQVar7->super_QWidgetPrivate + 0x28))
            (pQVar7,flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                    super_QFlagsStorage<Qt::WindowType>.i);
  QWidget::setBackgroundRole(&this->super_QWidget,Window);
  QWidget::setAutoFillBackground(&this->super_QWidget,true);
  QWidget::setAttribute(&this->super_QWidget,WA_MouseTracking,true);
  pQVar8 = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)pQVar8);
  QWidget::setLayout(&this->super_QWidget,pQVar8);
  QWidget::setFocusPolicy(&this->super_QWidget,StrongFocus);
  pQVar8 = QWidget::layout(&this->super_QWidget);
  local_48 = (undefined1  [8])0x0;
  ppQStack_40 = (QAction **)0x0;
  QLayout::setContentsMargins(pQVar8,(QMargins *)local_48);
  QMdiSubWindowPrivate::updateGeometryConstraints(pQVar7);
  QWidget::setAttribute(&this->super_QWidget,WA_Resized,false);
  QMdiSubWindowPrivate::desktopPalette((QMdiSubWindowPrivate *)local_48);
  CVar1 = (pQVar7->titleBarPalette).currentGroup;
  (pQVar7->titleBarPalette).currentGroup = ppQStack_40._0_4_;
  pQVar3 = (pQVar7->titleBarPalette).d;
  (pQVar7->titleBarPalette).d = (QPalettePrivate *)local_48;
  local_48 = (undefined1  [8])pQVar3;
  ppQStack_40._0_4_ = CVar1;
  QPalette::~QPalette((QPalette *)local_48);
  QApplication::font((QApplication *)local_48,"QMdiSubWindowTitleBar");
  pQVar4 = *(QIconPrivate **)&pQVar7->font;
  *(undefined1 (*) [8])&pQVar7->font = local_48;
  uVar2 = *(undefined4 *)&pQVar7->field_0x3d8;
  *(int *)&pQVar7->field_0x3d8 = ppQStack_40._0_4_;
  ppQStack_40 = (QAction **)CONCAT44(ppQStack_40._4_4_,uVar2);
  local_48 = (undefined1  [8])pQVar4;
  QFont::~QFont((QFont *)local_48);
  QWidget::windowIcon((QWidget *)local_48);
  cVar6 = QIcon::isNull();
  QIcon::~QIcon((QIcon *)local_48);
  if (cVar6 == '\0') {
    QWidget::windowIcon((QWidget *)local_50);
  }
  else {
    pQVar9 = QWidget::style(&this->super_QWidget);
    (**(code **)(*(long *)pQVar9 + 0x100))(local_50,pQVar9,0,0,this);
  }
  auVar5 = local_50;
  local_50 = (undefined1  [8])0x0;
  local_48 = (undefined1  [8])(pQVar7->menuIcon).d;
  (pQVar7->menuIcon).d = (QIconPrivate *)auVar5;
  QIcon::~QIcon((QIcon *)local_48);
  QIcon::~QIcon((QIcon *)local_50);
  QObject::connect((QObject *)&CStack_58,QCoreApplication::self,
                   (QObject *)"2focusChanged(QWidget*,QWidget*)",(char *)this,0x6db01f);
  QMetaObject::Connection::~Connection(&CStack_58);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMdiSubWindow::QMdiSubWindow(QWidget *parent, Qt::WindowFlags flags)
    : QWidget(*new QMdiSubWindowPrivate, parent, { })
{
    Q_D(QMdiSubWindow);
#if QT_CONFIG(menu)
    d->createSystemMenu();
    addActions(d->systemMenu->actions());
#endif
    d->setWindowFlags(flags);
    setBackgroundRole(QPalette::Window);
    setAutoFillBackground(true);
    setMouseTracking(true);
    setLayout(new QVBoxLayout);
    setFocusPolicy(Qt::StrongFocus);
    layout()->setContentsMargins(QMargins());
    d->updateGeometryConstraints();
    setAttribute(Qt::WA_Resized, false);
    d->titleBarPalette = d->desktopPalette();
    d->font = QApplication::font("QMdiSubWindowTitleBar");
    // We don't want the menu icon by default on mac.
#ifndef Q_OS_MAC
    if (windowIcon().isNull())
        d->menuIcon = style()->standardIcon(QStyle::SP_TitleBarMenuButton, nullptr, this);
    else
        d->menuIcon = windowIcon();
#endif
    connect(qApp, SIGNAL(focusChanged(QWidget*,QWidget*)),
            this, SLOT(_q_processFocusChanged(QWidget*,QWidget*)));
}